

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LDA.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  uint uVar1;
  char *pcVar2;
  typed_value<unsigned_int,_char> *ptVar3;
  typed_value<double,_char> *ptVar4;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar5;
  options_description *poVar6;
  basic_command_line_parser<char> *this;
  size_type sVar7;
  any *paVar8;
  uint *puVar9;
  size_type sVar10;
  double *pdVar11;
  VariationalBayesEstimatorOnLDA *this_00;
  ostream *poVar12;
  uint uVar13;
  allocator local_732;
  allocator local_731;
  string outputDirectory;
  key_type local_710;
  double local_6f0;
  string BOWFilename;
  string wordListFilename;
  string VLBTimeSeriesFilename;
  string VLBFilename;
  string betaFilename;
  string alphaFilename;
  string phiFilename;
  string thetaFilename;
  string local_5e0 [32];
  string local_5c0 [32];
  string local_5a0 [32];
  string local_580 [32];
  string local_560 [32];
  string local_540 [32];
  string local_520;
  string local_500;
  BOWFileParser parser;
  positional_options_description pd;
  variables_map vm;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_240 [144];
  options_description cmdline_options;
  options_description hidden;
  options_description opt;
  
  std::__cxx11::string::string((string *)&parser,"Options",(allocator *)&vm);
  uVar1 = (uint)boost::program_options::options_description::m_default_line_length;
  uVar13 = (uint)boost::program_options::options_description::m_default_line_length >> 1;
  boost::program_options::options_description::options_description
            (&opt,(string *)&parser,
             (uint)boost::program_options::options_description::m_default_line_length,uVar13);
  std::__cxx11::string::~string((string *)&parser);
  _vm = boost::program_options::options_description::add_options();
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)&vm,"help,h");
  ptVar3 = boost::program_options::value<unsigned_int>();
  _cmdline_options = 10;
  ptVar3 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                     (ptVar3,(uint *)&cmdline_options);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"nmtp,k",(char *)ptVar3);
  ptVar4 = boost::program_options::value<double>();
  _hidden = 0x3f50624dd2f1a9fc;
  ptVar4 = boost::program_options::typed_value<double,_char>::default_value
                     (ptVar4,(double *)&hidden);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"cdrt,d",(char *)ptVar4);
  ptVar5 = boost::program_options::value<std::__cxx11::string>();
  std::__cxx11::string::string((string *)&parser,"./",(allocator *)&pd);
  ptVar5 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&parser);
  boost::program_options::options_description_easy_init::operator()
            (pcVar2,(value_semantic *)"otpt,o",(char *)ptVar5);
  std::__cxx11::string::~string((string *)&parser);
  boost::program_options::positional_options_description::positional_options_description(&pd);
  boost::program_options::positional_options_description::add((char *)&pd,0x11629c);
  std::__cxx11::string::string((string *)&parser,"hidden",(allocator *)&vm);
  boost::program_options::options_description::options_description
            (&hidden,(string *)&parser,uVar1,uVar13);
  std::__cxx11::string::~string((string *)&parser);
  parser._0_8_ = boost::program_options::options_description::add_options();
  ptVar5 = boost::program_options::value<std::__cxx11::string>();
  boost::program_options::options_description_easy_init::operator()
            ((char *)&parser,(value_semantic *)0x11629c,(char *)ptVar5);
  boost::program_options::options_description::options_description(&cmdline_options,uVar1,uVar13);
  poVar6 = (options_description *)boost::program_options::options_description::add(&cmdline_options)
  ;
  boost::program_options::options_description::add(poVar6);
  boost::program_options::variables_map::variables_map(&vm);
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            ((basic_command_line_parser<char> *)&parser,argc,argv);
  this = boost::program_options::basic_command_line_parser<char>::options
                   ((basic_command_line_parser<char> *)&parser,&cmdline_options);
  boost::program_options::detail::cmdline::set_positional_options
            ((positional_options_description *)this);
  boost::program_options::basic_command_line_parser<char>::run
            ((basic_parsed_options<char> *)&BOWFilename,this);
  boost::program_options::store((basic_parsed_options *)&BOWFilename,&vm,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)&BOWFilename);
  boost::program_options::detail::cmdline::~cmdline((cmdline *)&parser);
  boost::program_options::notify(&vm);
  BOWFilename._M_dataplus._M_p = (pointer)&BOWFilename.field_2;
  BOWFilename._M_string_length = 0;
  outputDirectory._M_dataplus._M_p = (pointer)&outputDirectory.field_2;
  outputDirectory._M_string_length = 0;
  BOWFilename.field_2._M_local_buf[0] = '\0';
  outputDirectory.field_2._M_local_buf[0] = '\0';
  thetaFilename._M_dataplus._M_p = (pointer)&thetaFilename.field_2;
  thetaFilename._M_string_length = 0;
  phiFilename._M_dataplus._M_p = (pointer)&phiFilename.field_2;
  phiFilename._M_string_length = 0;
  thetaFilename.field_2._M_local_buf[0] = '\0';
  phiFilename.field_2._M_local_buf[0] = '\0';
  alphaFilename._M_dataplus._M_p = (pointer)&alphaFilename.field_2;
  alphaFilename._M_string_length = 0;
  betaFilename._M_dataplus._M_p = (pointer)&betaFilename.field_2;
  betaFilename._M_string_length = 0;
  alphaFilename.field_2._M_local_buf[0] = '\0';
  betaFilename.field_2._M_local_buf[0] = '\0';
  VLBFilename._M_dataplus._M_p = (pointer)&VLBFilename.field_2;
  VLBFilename._M_string_length = 0;
  VLBTimeSeriesFilename._M_dataplus._M_p = (pointer)&VLBTimeSeriesFilename.field_2;
  VLBTimeSeriesFilename._M_string_length = 0;
  VLBFilename.field_2._M_local_buf[0] = '\0';
  VLBTimeSeriesFilename.field_2._M_local_buf[0] = '\0';
  wordListFilename._M_dataplus._M_p = (pointer)&wordListFilename.field_2;
  wordListFilename._M_string_length = 0;
  wordListFilename.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&parser,"help",&local_731);
  sVar7 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(local_240,(key_type *)&parser);
  if (sVar7 == 0) {
    std::__cxx11::string::string((string *)&local_710,"BOWfile",&local_732);
    sVar7 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count(local_240,&local_710);
    std::__cxx11::string::~string((string *)&local_710);
    std::__cxx11::string::~string((string *)&parser);
    if (sVar7 != 0) {
      std::__cxx11::string::string((string *)&parser,"BOWfile",(allocator *)&local_710);
      paVar8 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm);
      boost::any_cast<std::__cxx11::string_const&>(paVar8);
      std::__cxx11::string::_M_assign((string *)&BOWFilename);
      std::__cxx11::string::~string((string *)&parser);
      std::__cxx11::string::string((string *)&parser,"nmtp",(allocator *)&local_710);
      sVar7 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
              ::count(local_240,(key_type *)&parser);
      std::__cxx11::string::~string((string *)&parser);
      if (sVar7 != 0) {
        std::__cxx11::string::string((string *)&parser,"nmtp",(allocator *)&local_710);
        paVar8 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm);
        puVar9 = boost::any_cast<unsigned_int_const&>(paVar8);
        sVar7 = (size_type)*puVar9;
        std::__cxx11::string::~string((string *)&parser);
      }
      std::__cxx11::string::string((string *)&parser,"cdrt",(allocator *)&local_710);
      sVar10 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               ::count(local_240,(key_type *)&parser);
      std::__cxx11::string::~string((string *)&parser);
      if (sVar10 != 0) {
        std::__cxx11::string::string((string *)&parser,"cdrt",(allocator *)&local_710);
        paVar8 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm);
        pdVar11 = boost::any_cast<double_const&>(paVar8);
        local_6f0 = *pdVar11;
        std::__cxx11::string::~string((string *)&parser);
      }
      std::__cxx11::string::string((string *)&parser,"otpt",(allocator *)&local_710);
      sVar10 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               ::count(local_240,(key_type *)&parser);
      std::__cxx11::string::~string((string *)&parser);
      if (sVar10 != 0) {
        std::__cxx11::string::string((string *)&parser,"otpt",(allocator *)&local_710);
        paVar8 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm);
        boost::any_cast<std::__cxx11::string_const&>(paVar8);
        std::__cxx11::string::_M_assign((string *)&outputDirectory);
        std::__cxx11::string::~string((string *)&parser);
      }
      if (outputDirectory._M_dataplus._M_p[outputDirectory._M_string_length - 1] != '/') {
        std::__cxx11::string::push_back((char)&outputDirectory);
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&parser,
                     &outputDirectory,"theta.csv");
      std::__cxx11::string::operator=((string *)&thetaFilename,(string *)&parser);
      std::__cxx11::string::~string((string *)&parser);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&parser,
                     &outputDirectory,"phi.csv");
      std::__cxx11::string::operator=((string *)&phiFilename,(string *)&parser);
      std::__cxx11::string::~string((string *)&parser);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&parser,
                     &outputDirectory,"alpha.csv");
      std::__cxx11::string::operator=((string *)&alphaFilename,(string *)&parser);
      std::__cxx11::string::~string((string *)&parser);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&parser,
                     &outputDirectory,"beta.csv");
      std::__cxx11::string::operator=((string *)&betaFilename,(string *)&parser);
      std::__cxx11::string::~string((string *)&parser);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&parser,
                     &outputDirectory,"variationalLowerBound.csv");
      std::__cxx11::string::operator=((string *)&VLBFilename,(string *)&parser);
      std::__cxx11::string::~string((string *)&parser);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&parser,
                     &outputDirectory,"VLBTimeSeries.csv");
      std::__cxx11::string::operator=((string *)&VLBTimeSeriesFilename,(string *)&parser);
      std::__cxx11::string::~string((string *)&parser);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&parser,
                     &outputDirectory,"wordList.csv");
      std::__cxx11::string::operator=((string *)&wordListFilename,(string *)&parser);
      std::__cxx11::string::~string((string *)&parser);
      std::__cxx11::string::string((string *)&local_500,(string *)&BOWFilename);
      BOWFileParser::BOWFileParser(&parser,&local_500);
      std::__cxx11::string::~string((string *)&local_500);
      std::__cxx11::string::string((string *)&local_520,(string *)&wordListFilename);
      BOWFileParser::writeWordList(&parser,&local_520);
      std::__cxx11::string::~string((string *)&local_520);
      this_00 = (VariationalBayesEstimatorOnLDA *)operator_new(0x168);
      VariationalBayesEstimatorOnLDA::VariationalBayesEstimatorOnLDA
                (this_00,&parser,(uint)sVar7,local_6f0);
      (*this_00->_vptr_VariationalBayesEstimatorOnLDA[0xd])(this_00);
      std::__cxx11::string::string(local_540,(string *)&thetaFilename);
      std::__cxx11::string::string(local_560,(string *)&phiFilename);
      std::__cxx11::string::string(local_580,(string *)&alphaFilename);
      std::__cxx11::string::string(local_5a0,(string *)&betaFilename);
      (*this_00->_vptr_VariationalBayesEstimatorOnLDA[0xb])
                (this_00,local_540,local_560,local_580,local_5a0);
      std::__cxx11::string::~string(local_5a0);
      std::__cxx11::string::~string(local_580);
      std::__cxx11::string::~string(local_560);
      std::__cxx11::string::~string(local_540);
      std::__cxx11::string::string(local_5c0,(string *)&VLBFilename);
      std::__cxx11::string::string(local_5e0,(string *)&VLBTimeSeriesFilename);
      (*this_00->_vptr_VariationalBayesEstimatorOnLDA[0xc])(this_00,local_5c0,local_5e0);
      std::__cxx11::string::~string(local_5e0);
      std::__cxx11::string::~string(local_5c0);
      (*this_00->_vptr_VariationalBayesEstimatorOnLDA[1])(this_00);
      BOWFileParser::~BOWFileParser(&parser);
      std::__cxx11::string::~string((string *)&wordListFilename);
      std::__cxx11::string::~string((string *)&VLBTimeSeriesFilename);
      std::__cxx11::string::~string((string *)&VLBFilename);
      std::__cxx11::string::~string((string *)&betaFilename);
      std::__cxx11::string::~string((string *)&alphaFilename);
      std::__cxx11::string::~string((string *)&phiFilename);
      std::__cxx11::string::~string((string *)&thetaFilename);
      std::__cxx11::string::~string((string *)&outputDirectory);
      std::__cxx11::string::~string((string *)&BOWFilename);
      boost::program_options::variables_map::~variables_map(&vm);
      boost::program_options::options_description::~options_description(&cmdline_options);
      boost::program_options::options_description::~options_description(&hidden);
      boost::program_options::positional_options_description::~positional_options_description(&pd);
      boost::program_options::options_description::~options_description(&opt);
      return 0;
    }
  }
  else {
    std::__cxx11::string::~string((string *)&parser);
  }
  poVar12 = std::operator<<((ostream *)&std::cout,"Usage:\n LDA [BOW file] [-options] ");
  std::endl<char,std::char_traits<char>>(poVar12);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar12 = (ostream *)boost::program_options::operator<<((ostream *)&std::cout,&opt);
  std::endl<char,std::char_traits<char>>(poVar12);
  exit(1);
}

Assistant:

int main(int argc, char *argv[]){

    //Options{{{
    boost::program_options::options_description opt("Options");
    opt.add_options()
    ("help,h", "show help")
    ("nmtp,k", boost::program_options::value<unsigned int>()->default_value(10), "number of topics")
    ("cdrt,d", boost::program_options::value<double>()->default_value(0.001), "convergence ditermination rate")
    ("otpt,o", boost::program_options::value<string>()->default_value("./"), "directory name for output")
    ;

    boost::program_options::positional_options_description pd;
    pd.add("BOWfile", 1);

    boost::program_options::options_description hidden("hidden");
    hidden.add_options()
        ("BOWfile", boost::program_options::value<string>(), "hidden")
        ;
    boost::program_options::options_description cmdline_options;
    cmdline_options.add(opt).add(hidden);

    boost::program_options::variables_map vm;
    try{
        boost::program_options::store(boost::program_options::command_line_parser(argc, argv).options(cmdline_options).positional(pd).run(), vm);
    // }catch(const boost::program_options::error_with_option_name& e){
    //     cout<<e.what()<<endl;
    }catch(...){
        cout<<"Option error."<<endl;
    }
    boost::program_options::notify(vm);
    string BOWFilename;
    unsigned int K;
    double convergenceDiterminationRate;
    string outputDirectory;
    string thetaFilename;
    string phiFilename;
    string alphaFilename;
    string betaFilename;
    string VLBFilename;
    string VLBTimeSeriesFilename;
    string wordListFilename;
    if (vm.count("help") || !vm.count("BOWfile")){
        cout<<"Usage:\n LDA [BOW file] [-options] "<<endl;
        cout<<endl;
        cout<<opt<<endl;
        exit(1);
    }else{
        BOWFilename = vm["BOWfile"].as<std::string>();
        if(vm.count("nmtp"))K = vm["nmtp"].as<unsigned int>();
        if(vm.count("cdrt"))convergenceDiterminationRate = vm["cdrt"].as<double>();
        if(vm.count("otpt"))outputDirectory = vm["otpt"].as<std::string>();
        if(outputDirectory[outputDirectory.size()-1] != '/')outputDirectory.push_back('/');
        thetaFilename = outputDirectory + "theta.csv";
        phiFilename = outputDirectory + "phi.csv";
        alphaFilename = outputDirectory + "alpha.csv";
        betaFilename = outputDirectory + "beta.csv";
        VLBFilename = outputDirectory + "variationalLowerBound.csv";
        VLBTimeSeriesFilename = outputDirectory + "VLBTimeSeries.csv";
        wordListFilename = outputDirectory + "wordList.csv";
    }

    BOWFileParser parser(BOWFilename);
    parser.writeWordList(wordListFilename);
    //}}}

//estimation{{{
    VariationalBayesEstimatorOnLDA *estimator;
    estimator = new VariationalBayesEstimatorOnLDA(parser, K, convergenceDiterminationRate);
    estimator->runIteraions();
    estimator->writeParameter(thetaFilename, phiFilename, alphaFilename, betaFilename);
    estimator->writeVariationalLowerBound(VLBFilename, VLBTimeSeriesFilename);
    delete estimator;
//}}}
    return 0;
}